

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::TiledOutputFile::copyPixels(TiledOutputFile *this,TiledInputFile *in)

{
  LineOrder LVar1;
  bool bVar2;
  undefined1 uVar3;
  LevelMode LVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  ArgExc *pAVar9;
  TileDescription *this_00;
  TileDescription *other;
  Box2i *lx_00;
  Box2i *ly_00;
  LineOrder *pLVar10;
  Compression *pCVar11;
  TiledOutputFile *this_01;
  LogicExc *this_02;
  reference pvVar12;
  Data *in_RSI;
  TiledOutputFile *in_RDI;
  TileCoord TVar13;
  int ly;
  int lx;
  int dy;
  int dx;
  int pixelDataSize;
  char *pixelData;
  int i;
  vector<int,_std::allocator<int>_> ly_table;
  vector<int,_std::allocator<int>_> lx_table;
  vector<int,_std::allocator<int>_> dy_table;
  vector<int,_std::allocator<int>_> dx_table;
  bool random_y;
  int i_lx;
  int i_ly;
  int i_l;
  int numAllTiles;
  stringstream _iex_throw_s_6;
  stringstream _iex_throw_s_5;
  stringstream _iex_throw_s_4;
  stringstream _iex_throw_s_3;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  Header *inHdr;
  Header *hdr;
  Lock lock;
  int *in_stack_fffffffffffff128;
  undefined4 in_stack_fffffffffffff130;
  undefined4 in_stack_fffffffffffff134;
  Box<Imath_2_5::Vec2<int>_> *in_stack_fffffffffffff138;
  Lock *in_stack_fffffffffffff140;
  Data *in_stack_fffffffffffff148;
  Data *in_stack_fffffffffffff150;
  TileOffsets *in_stack_fffffffffffff158;
  reference in_stack_fffffffffffff160;
  reference in_stack_fffffffffffff168;
  ChannelList *in_stack_fffffffffffff170;
  ChannelList *in_stack_fffffffffffff178;
  TiledOutputFile *in_stack_fffffffffffff2e0;
  Compression lx_01;
  undefined7 in_stack_fffffffffffff388;
  int *in_stack_fffffffffffff3a0;
  int *in_stack_fffffffffffff3a8;
  TiledInputFile *in_stack_fffffffffffff3b0;
  int *in_stack_fffffffffffff3c0;
  undefined4 local_b9c;
  int local_b90;
  vector<int,_std::allocator<int>_> local_b88;
  vector<int,_std::allocator<int>_> local_b68;
  vector<int,_std::allocator<int>_> local_b48;
  vector<int,_std::allocator<int>_> local_b28;
  byte local_b09;
  int local_b08;
  int local_b04;
  int local_b00;
  int local_afc;
  stringstream local_af8 [16];
  ostream local_ae8 [376];
  stringstream local_970 [16];
  ostream local_960 [376];
  stringstream local_7e8 [16];
  ostream local_7d8 [376];
  stringstream local_660 [16];
  ostream local_650 [376];
  stringstream local_4d8 [16];
  ostream local_4c8 [376];
  stringstream local_350 [16];
  ostream local_340 [376];
  stringstream local_1c8 [16];
  ostream local_1b8 [392];
  Header *local_30;
  Data *local_28;
  Data *local_10;
  
  local_10 = in_RSI;
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffff140,(Mutex *)in_stack_fffffffffffff138,
             SUB41((uint)in_stack_fffffffffffff134 >> 0x18,0));
  local_28 = in_RDI->_data;
  local_30 = TiledInputFile::header((TiledInputFile *)local_10);
  bVar2 = Header::hasTileDescription((Header *)0x1a5985);
  if ((!bVar2) || (bVar2 = Header::hasTileDescription((Header *)0x1a59a8), !bVar2)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c8);
    poVar7 = std::operator<<(local_1b8,"Cannot perform a quick pixel copy from image file \"");
    pcVar8 = TiledInputFile::fileName((TiledInputFile *)0x1a5a05);
    poVar7 = std::operator<<(poVar7,pcVar8);
    poVar7 = std::operator<<(poVar7,"\" to image file \"");
    pcVar8 = fileName((TiledOutputFile *)0x1a5a59);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::operator<<(poVar7,
                    "\".  The output file is tiled, but the input file is not.  Try using OutputFile::copyPixels() instead."
                   );
    pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar9,local_1c8);
    __cxa_throw(pAVar9,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  this_00 = Header::tileDescription((Header *)0x1a5b26);
  other = Header::tileDescription((Header *)0x1a5b3d);
  bVar2 = TileDescription::operator==(this_00,other);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_350);
    poVar7 = std::operator<<(local_340,"Quick pixel copy from image file \"");
    pcVar8 = TiledInputFile::fileName((TiledInputFile *)0x1a5bb9);
    poVar7 = std::operator<<(poVar7,pcVar8);
    poVar7 = std::operator<<(poVar7,"\" to image file \"");
    pcVar8 = fileName((TiledOutputFile *)0x1a5c0d);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::operator<<(poVar7,"\" failed. The files have different tile descriptions.");
    pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar9,local_350);
    __cxa_throw(pAVar9,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  lx_00 = Header::dataWindow((Header *)0x1a5cc1);
  ly_00 = Header::dataWindow((Header *)0x1a5cd8);
  uVar3 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffff140,
                     in_stack_fffffffffffff138);
  if (!(bool)uVar3) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_4d8);
    poVar7 = std::operator<<(local_4c8,"Cannot copy pixels from image file \"");
    pcVar8 = TiledInputFile::fileName((TiledInputFile *)0x1a5d54);
    poVar7 = std::operator<<(poVar7,pcVar8);
    poVar7 = std::operator<<(poVar7,"\" to image file \"");
    pcVar8 = fileName((TiledOutputFile *)0x1a5da8);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::operator<<(poVar7,"\". The files have different data windows.");
    pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar9,local_4d8);
    __cxa_throw(pAVar9,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pLVar10 = Header::lineOrder((Header *)0x1a5e5c);
  LVar1 = *pLVar10;
  pLVar10 = Header::lineOrder((Header *)0x1a5e84);
  if (LVar1 != *pLVar10) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_660);
    poVar7 = std::operator<<(local_650,"Quick pixel copy from image file \"");
    pcVar8 = TiledInputFile::fileName((TiledInputFile *)0x1a5ee8);
    poVar7 = std::operator<<(poVar7,pcVar8);
    poVar7 = std::operator<<(poVar7,"\" to image file \"");
    pcVar8 = fileName((TiledOutputFile *)0x1a5f3c);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::operator<<(poVar7,"\" failed. The files have different line orders.");
    pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar9,local_660);
    __cxa_throw(pAVar9,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pCVar11 = Header::compression((Header *)0x1a5ff0);
  lx_01 = *pCVar11;
  this_01 = (TiledOutputFile *)Header::compression((Header *)0x1a6018);
  if (lx_01 != *(Compression *)&(this_01->super_GenericOutputFile)._vptr_GenericOutputFile) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_7e8);
    poVar7 = std::operator<<(local_7d8,"Quick pixel copy from image file \"");
    pcVar8 = TiledInputFile::fileName((TiledInputFile *)0x1a607c);
    poVar7 = std::operator<<(poVar7,pcVar8);
    poVar7 = std::operator<<(poVar7,"\" to image file \"");
    pcVar8 = fileName((TiledOutputFile *)0x1a60d0);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::operator<<(poVar7,"\" failed. The files use different compression methods.");
    pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar9,local_7e8);
    __cxa_throw(pAVar9,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  Header::channels((Header *)0x1a6184);
  Header::channels((Header *)0x1a619b);
  bVar2 = ChannelList::operator==(in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_970);
    poVar7 = std::operator<<(local_960,"Quick pixel copy from image file \"");
    pcVar8 = TiledInputFile::fileName((TiledInputFile *)0x1a6217);
    poVar7 = std::operator<<(poVar7,pcVar8);
    poVar7 = std::operator<<(poVar7,"\" to image file \"");
    pcVar8 = fileName((TiledOutputFile *)0x1a626b);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::operator<<(poVar7,"\" failed.  The files have different channel lists.");
    pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar9,local_970);
    __cxa_throw(pAVar9,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  bVar2 = TileOffsets::isEmpty(in_stack_fffffffffffff158);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_af8);
    poVar7 = std::operator<<(local_ae8,"Quick pixel copy from image file \"");
    pcVar8 = TiledInputFile::fileName((TiledInputFile *)0x1a6387);
    poVar7 = std::operator<<(poVar7,pcVar8);
    poVar7 = std::operator<<(poVar7,"\" to image file \"");
    pcVar8 = OStream::fileName((OStream *)0x1a63e3);
    poVar7 = std::operator<<(poVar7,pcVar8);
    poVar7 = std::operator<<(poVar7,"\" failed. \"");
    pcVar8 = fileName((TiledOutputFile *)0x1a6437);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::operator<<(poVar7,"\" already contains pixel data.");
    this_02 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::LogicExc::LogicExc(this_02,local_af8);
    __cxa_throw(this_02,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
  }
  local_afc = 0;
  LVar4 = levelMode(in_RDI);
  if (LVar4 < RIPMAP_LEVELS) {
    for (local_b00 = 0; iVar6 = local_b00, iVar5 = numLevels(in_stack_fffffffffffff2e0),
        iVar6 < iVar5; local_b00 = local_b00 + 1) {
      iVar6 = numXTiles(this_01,lx_01);
      iVar5 = numYTiles(this_01,lx_01);
      local_afc = iVar6 * iVar5 + local_afc;
    }
  }
  else {
    if (LVar4 != RIPMAP_LEVELS) {
      pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar9,"Unknown LevelMode format.");
      __cxa_throw(pAVar9,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    for (local_b04 = 0; iVar6 = local_b04, iVar5 = numYLevels(in_RDI), iVar6 < iVar5;
        local_b04 = local_b04 + 1) {
      for (local_b08 = 0; iVar6 = local_b08, iVar5 = numXLevels(in_RDI), iVar6 < iVar5;
          local_b08 = local_b08 + 1) {
        iVar6 = numXTiles(this_01,lx_01);
        iVar5 = numYTiles(this_01,lx_01);
        local_afc = iVar6 * iVar5 + local_afc;
      }
    }
  }
  local_b09 = in_RDI->_data->lineOrder == RANDOM_Y;
  std::allocator<int>::allocator((allocator<int> *)0x1a6794);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff150,
             (size_type)in_stack_fffffffffffff148,(allocator_type *)in_stack_fffffffffffff140);
  std::allocator<int>::~allocator((allocator<int> *)0x1a67c0);
  std::allocator<int>::allocator((allocator<int> *)0x1a680b);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff150,
             (size_type)in_stack_fffffffffffff148,(allocator_type *)in_stack_fffffffffffff140);
  std::allocator<int>::~allocator((allocator<int> *)0x1a6834);
  std::allocator<int>::allocator((allocator<int> *)0x1a6873);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff150,
             (size_type)in_stack_fffffffffffff148,(allocator_type *)in_stack_fffffffffffff140);
  std::allocator<int>::~allocator((allocator<int> *)0x1a6899);
  std::allocator<int>::allocator((allocator<int> *)0x1a68d8);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff150,
             (size_type)in_stack_fffffffffffff148,(allocator_type *)in_stack_fffffffffffff140);
  std::allocator<int>::~allocator((allocator<int> *)0x1a68fe);
  if ((local_b09 & 1) != 0) {
    in_stack_fffffffffffff148 = (Data *)0x0;
    std::vector<int,_std::allocator<int>_>::operator[](&local_b28,0);
    in_stack_fffffffffffff160 =
         std::vector<int,_std::allocator<int>_>::operator[]
                   (&local_b48,(size_type)in_stack_fffffffffffff148);
    in_stack_fffffffffffff168 =
         std::vector<int,_std::allocator<int>_>::operator[]
                   (&local_b68,(size_type)in_stack_fffffffffffff148);
    std::vector<int,_std::allocator<int>_>::operator[]
              (&local_b88,(size_type)in_stack_fffffffffffff148);
    TiledInputFile::tileOrder
              ((TiledInputFile *)in_stack_fffffffffffff140,(int *)in_stack_fffffffffffff138,
               (int *)CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130),
               in_stack_fffffffffffff128,(int *)0x1a6990);
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_b28,0);
    (in_RDI->_data->nextTileToWrite).dx = *pvVar12;
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_b48,0);
    (in_RDI->_data->nextTileToWrite).dy = *pvVar12;
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_b68,0);
    (in_RDI->_data->nextTileToWrite).lx = *pvVar12;
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_b88,0);
    (in_RDI->_data->nextTileToWrite).ly = *pvVar12;
    in_stack_fffffffffffff150 = local_10;
  }
  TVar13._8_8_ = in_stack_fffffffffffff138;
  TVar13._0_8_ = in_stack_fffffffffffff140;
  for (local_b90 = 0; local_b90 < local_afc; local_b90 = local_b90 + 1) {
    TiledInputFile::rawTileData
              (in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0,
               (int *)lx_00,(int *)ly_00,(char **)CONCAT17(uVar3,in_stack_fffffffffffff388),
               in_stack_fffffffffffff3c0);
    in_stack_fffffffffffff130 = local_b9c;
    anon_unknown_5::writeTileData
              ((OutputStreamMutex *)in_stack_fffffffffffff150,in_stack_fffffffffffff148,TVar13.dy,
               TVar13.dx,TVar13.ly,TVar13.lx,(char *)in_stack_fffffffffffff160,
               (int)in_stack_fffffffffffff168);
    if ((local_b09 & 1) == 0) {
      TVar13 = Data::nextTileCoord(in_stack_fffffffffffff150,(TileCoord *)in_stack_fffffffffffff148)
      ;
      in_RDI->_data->nextTileToWrite = TVar13;
    }
    else if (local_b90 < local_afc + -1) {
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_b28,(long)(local_b90 + 1))
      ;
      (in_RDI->_data->nextTileToWrite).dx = *pvVar12;
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_b48,(long)(local_b90 + 1))
      ;
      (in_RDI->_data->nextTileToWrite).dy = *pvVar12;
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_b68,(long)(local_b90 + 1))
      ;
      (in_RDI->_data->nextTileToWrite).lx = *pvVar12;
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_b88,(long)(local_b90 + 1))
      ;
      (in_RDI->_data->nextTileToWrite).ly = *pvVar12;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector(TVar13._0_8_);
  std::vector<int,_std::allocator<int>_>::~vector(TVar13._0_8_);
  std::vector<int,_std::allocator<int>_>::~vector(TVar13._0_8_);
  std::vector<int,_std::allocator<int>_>::~vector(TVar13._0_8_);
  IlmThread_2_5::Lock::~Lock((Lock *)CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130));
  return;
}

Assistant:

void	
TiledOutputFile::copyPixels (TiledInputFile &in)
{
    Lock lock (*_streamData);

    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header &hdr = _data->header;
    const Header &inHdr = in.header(); 

    if (!hdr.hasTileDescription() || !inHdr.hasTileDescription())
        THROW (IEX_NAMESPACE::ArgExc, "Cannot perform a quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\".  The "
                            "output file is tiled, but the input file is not.  "
                            "Try using OutputFile::copyPixels() instead.");

    if (!(hdr.tileDescription() == inHdr.tileDescription()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed. "
			    "The files have different tile descriptions.");

    if (!(hdr.dataWindow() == inHdr.dataWindow()))
        THROW (IEX_NAMESPACE::ArgExc, "Cannot copy pixels from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\". The "
                            "files have different data windows.");

    if (!(hdr.lineOrder() == inHdr.lineOrder()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed. "
			    "The files have different line orders.");

    if (!(hdr.compression() == inHdr.compression()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed. "
			    "The files use different compression methods.");

    if (!(hdr.channels() == inHdr.channels()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			     "file \"" << in.fileName() << "\" to image "
			     "file \"" << fileName() << "\" "
                             "failed.  The files have different channel "
                             "lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    if (!_data->tileOffsets.isEmpty())
        THROW (IEX_NAMESPACE::LogicExc, "Quick pixel copy from image "
			      "file \"" << in.fileName() << "\" to image "
			      "file \"" << _streamData->os->fileName() << "\" "
                              "failed. \"" << fileName() << "\" "
                              "already contains pixel data.");

    //
    // Calculate the total number of tiles in the file
    //

    int numAllTiles = 0;

    switch (levelMode ())
    {
      case ONE_LEVEL:
      case MIPMAP_LEVELS:

        for (int i_l = 0; i_l < numLevels (); ++i_l)
            numAllTiles += numXTiles (i_l) * numYTiles (i_l);

        break;

      case RIPMAP_LEVELS:

        for (int i_ly = 0; i_ly < numYLevels (); ++i_ly)
            for (int i_lx = 0; i_lx < numXLevels (); ++i_lx)
                numAllTiles += numXTiles (i_lx) * numYTiles (i_ly);

        break;

      default:

        throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }

     bool random_y = _data->lineOrder==RANDOM_Y;

    std::vector<int> dx_table(random_y ? numAllTiles : 1);
    std::vector<int> dy_table(random_y ? numAllTiles : 1);
    std::vector<int> lx_table(random_y ? numAllTiles : 1);
    std::vector<int> ly_table(random_y ? numAllTiles : 1);
    
    if(random_y)
    {
        in.tileOrder(&dx_table[0],&dy_table[0],&lx_table[0],&ly_table[0]);
        _data->nextTileToWrite.dx=dx_table[0];
        _data->nextTileToWrite.dy=dy_table[0];
        _data->nextTileToWrite.lx=lx_table[0];
        _data->nextTileToWrite.ly=ly_table[0];
    }

    for (int i = 0; i < numAllTiles; ++i)
    {
        const char *pixelData;
        int pixelDataSize;
        
        int dx = _data->nextTileToWrite.dx;
        int dy = _data->nextTileToWrite.dy;
        int lx = _data->nextTileToWrite.lx;
        int ly = _data->nextTileToWrite.ly;

        
        in.rawTileData (dx, dy, lx, ly, pixelData, pixelDataSize);
        writeTileData (_streamData, _data, dx, dy, lx, ly, pixelData, pixelDataSize);
        
        if(random_y)
        {
            if(i<numAllTiles-1)
            {
               _data->nextTileToWrite.dx=dx_table[i+1];
               _data->nextTileToWrite.dy=dy_table[i+1];
               _data->nextTileToWrite.lx=lx_table[i+1];
               _data->nextTileToWrite.ly=ly_table[i+1];
            }
        }else{
            _data->nextTileToWrite=_data->nextTileCoord(_data->nextTileToWrite);
        }
    }
}